

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astnode.cpp
# Opt level: O0

void __thiscall ASTNode::execute(ASTNode *this)

{
  ASTException *this_00;
  allocator local_31;
  string local_30;
  ASTNode *local_10;
  ASTNode *this_local;
  
  local_10 = this;
  this_00 = (ASTException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"No execute method",&local_31);
  ASTException::ASTException(this_00,&local_30);
  __cxa_throw(this_00,&ASTException::typeinfo,ASTException::~ASTException);
}

Assistant:

void ASTNode::execute() {
    throw ASTException("No execute method");
}